

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsuite.c
# Opt level: O3

xmlParserErrors
testResourceLoader(void *vctxt,char *URL,char *ID,xmlResourceType type,xmlParserInputFlags flags,
                  xmlParserInputPtr *out)

{
  char *__s1;
  int iVar1;
  xmlParserErrors xVar2;
  xmlParserInputPtr pxVar3;
  long lVar4;
  long lVar5;
  
  lVar4 = (long)nb_entities;
  if (0 < lVar4) {
    lVar5 = 0;
    do {
      __s1 = *(char **)((long)testEntitiesName + lVar5);
      iVar1 = strcmp(__s1,URL);
      if (iVar1 == 0) {
        pxVar3 = (xmlParserInputPtr)
                 xmlNewInputFromString(__s1,*(undefined8 *)((long)testEntitiesValue + lVar5),2);
        *out = pxVar3;
        return XML_ERR_OK;
      }
      lVar5 = lVar5 + 8;
    } while (lVar4 * 8 != lVar5);
  }
  xVar2 = xmlNewInputFromUrl(URL,0,out);
  return xVar2;
}

Assistant:

static xmlParserErrors
testResourceLoader(void *vctxt ATTRIBUTE_UNUSED, const char *URL,
                   const char *ID ATTRIBUTE_UNUSED,
                   xmlResourceType type ATTRIBUTE_UNUSED,
                   xmlParserInputFlags flags ATTRIBUTE_UNUSED,
                   xmlParserInputPtr *out) {
    int i;

    for (i = 0; i < nb_entities; i++) {
        if (!strcmp(testEntitiesName[i], URL)) {
	    *out = xmlNewInputFromString(testEntitiesName[i],
                                        testEntitiesValue[i],
                                        XML_INPUT_BUF_STATIC);
	    return(XML_ERR_OK);
	}
    }

    return(xmlNewInputFromUrl(URL, 0, out));
}